

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::lts_20240722::Cord::SetCrcCordState(Cord *this,CrcCordState *state)

{
  byte bVar1;
  undefined8 uVar2;
  CordzUpdateScope CVar3;
  ulong uVar4;
  CordRepFlat *pCVar5;
  CordRep *pCVar6;
  SamplingState *pSVar7;
  long lVar8;
  CrcCordState *this_00;
  ulong uVar9;
  CordzUpdateScope scope;
  CrcCordState local_40 [8];
  CordzUpdateScope local_38;
  CrcCordState local_30 [8];
  CrcCordState local_28 [8];
  
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  uVar9 = (ulong)(char)bVar1;
  if ((uVar9 & 1) == 0) {
    uVar4 = uVar9 >> 1;
  }
  else {
    uVar4 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar4 == 0) {
    pCVar6 = (this->contents_).data_.rep_.field_0.as_tree.rep;
    if ((pCVar6 != (CordRep *)0x0 && (bVar1 & 1) != 0) && (pCVar6->length == 0)) {
      SetCrcCordState();
    }
    absl::lts_20240722::crc_internal::CrcCordState::CrcCordState(local_28,state);
    pCVar6 = (CordRep *)absl::lts_20240722::cord_internal::CordRepCrc::New(0,local_28);
    this_00 = local_28;
  }
  else {
    if ((uVar9 & 1) != 0) {
      local_38.info_ = cord_internal::InlineData::cordz_info((InlineData *)this);
      if (local_38.info_ != (CordzInfo *)0x0) {
        absl::lts_20240722::cord_internal::CordzInfo::Lock((MethodIdentifier)local_38.info_);
      }
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
        __assert_fail("is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x272,"CordRep *absl::cord_internal::InlineData::as_tree() const");
      }
      pCVar6 = (this->contents_).data_.rep_.field_0.as_tree.rep;
      absl::lts_20240722::crc_internal::CrcCordState::CrcCordState(local_40,state);
      pCVar6 = (CordRep *)absl::lts_20240722::cord_internal::CordRepCrc::New(pCVar6,local_40);
      absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState(local_40);
      CVar3.info_ = local_38.info_;
      if (pCVar6 == (CordRep *)0x0) {
        __assert_fail("rep",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x500,
                      "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                     );
      }
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar6;
        if (local_38.info_ != (CordzInfo *)0x0) {
          absl::lts_20240722::Mutex::AssertHeld();
          *(CordRep **)(CVar3.info_ + 0x40) = pCVar6;
        }
        cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_38);
        return;
      }
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x501,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    pCVar5 = cord_internal::CordRepFlat::NewImpl<4096ul>(uVar9 >> 1);
    (pCVar5->super_CordRep).length = uVar9 >> 1;
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
      __assert_fail("!is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x27f,"void absl::cord_internal::InlineData::copy_max_inline_to(char *) const")
      ;
    }
    uVar2 = *(undefined8 *)((long)&(this->contents_).data_.rep_.field_0.as_tree.cordz_info + 1);
    *(CordRep **)((long)&pCVar5[1].super_CordRep.length + 4) =
         (this->contents_).data_.rep_.field_0.as_tree.rep;
    *(undefined8 *)(pCVar5->super_CordRep).storage = uVar2;
    absl::lts_20240722::crc_internal::CrcCordState::CrcCordState(local_30,state);
    pCVar6 = (CordRep *)absl::lts_20240722::cord_internal::CordRepCrc::New(pCVar5,local_30);
    this_00 = local_30;
  }
  absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState(this_00);
  if (pCVar6 != (CordRep *)0x0) {
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar6;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
    pSVar7 = (SamplingState *)__tls_get_addr(&PTR_0011efd0);
    if (pSVar7->next_sample < 2) {
      lVar8 = absl::lts_20240722::cord_internal::cordz_should_profile_slow(pSVar7);
    }
    else {
      pSVar7->next_sample = pSVar7->next_sample + -1;
      lVar8 = 0;
    }
    if (0 < lVar8) {
      absl::lts_20240722::cord_internal::CordzInfo::TrackCord
                ((InlineData *)this,kSetExpectedChecksum,lVar8);
    }
    return;
  }
  __assert_fail("rep",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                ,0x4f2,
                "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
               );
}

Assistant:

void Cord::SetCrcCordState(crc_internal::CrcCordState state) {
  auto constexpr method = CordzUpdateTracker::kSetExpectedChecksum;
  if (empty()) {
    contents_.MaybeRemoveEmptyCrcNode();
    CordRep* rep = CordRepCrc::New(nullptr, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else if (!contents_.is_tree()) {
    CordRep* rep = contents_.MakeFlatWithExtraCapacity(0);
    rep = CordRepCrc::New(rep, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else {
    const CordzUpdateScope scope(contents_.data_.cordz_info(), method);
    CordRep* rep = CordRepCrc::New(contents_.data_.as_tree(), std::move(state));
    contents_.SetTree(rep, scope);
  }
}